

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O1

void __thiscall
QDBusPlatformMenu::removeMenuItem(QDBusPlatformMenu *this,QPlatformMenuItem *menuItem)

{
  QObject *pQVar1;
  QDBusPlatformMenu *menu;
  long in_FS_OFFSET;
  QGridLayoutItem *local_58;
  undefined8 local_50;
  anon_class_8_1_54a39814_for__M_pred_conflict7 local_48;
  undefined8 local_40;
  long local_38;
  
  local_48.t = &local_58;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (QGridLayoutItem *)menuItem;
  QtPrivate::
  sequential_erase_if<QList<QDBusPlatformMenuItem*>,QtPrivate::sequential_erase<QList<QDBusPlatformMenuItem*>,QDBusPlatformMenuItem*>(QList<QDBusPlatformMenuItem*>&,QDBusPlatformMenuItem*const&)::_lambda(auto:1_const&)_1_>
            ((QList<QDBusPlatformMenuItem_*> *)(this + 0x48),&local_48);
  local_48.t = (QGridLayoutItem **)(**(code **)(*(long *)menuItem + 0x68))(menuItem);
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::removeImpl<unsigned_long_long>
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)(this + 0x40),
             (unsigned_long_long *)&local_48);
  pQVar1 = *(QObject **)&menuItem[2].field_0x8;
  if (pQVar1 != (QObject *)0x0) {
    local_48.t = (QGridLayoutItem **)propertiesUpdated;
    local_40 = 0;
    local_58 = (QGridLayoutItem *)propertiesUpdated;
    local_50 = 0;
    QObject::disconnectImpl(pQVar1,&local_48.t,(QObject *)this,&local_58,&staticMetaObject);
    local_48.t = (QGridLayoutItem **)updated;
    local_40 = 0;
    local_58 = (QGridLayoutItem *)updated;
    local_50 = 0;
    QObject::disconnectImpl(pQVar1,&local_48.t,(QObject *)this,&local_58,&staticMetaObject);
    local_48.t = (QGridLayoutItem **)popupRequested;
    local_40 = 0;
    local_58 = (QGridLayoutItem *)popupRequested;
    local_50 = 0;
    QObject::disconnectImpl(pQVar1,&local_48.t,(QObject *)this,&local_58,&staticMetaObject);
  }
  emitUpdated(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::removeMenuItem(QPlatformMenuItem *menuItem)
{
    QDBusPlatformMenuItem *item = static_cast<QDBusPlatformMenuItem *>(menuItem);
    m_items.removeAll(item);
    m_itemsByTag.remove(menuItem->tag());
    if (item->menu()) {
        // disconnect from the signals we connected to in syncSubMenu()
        const QDBusPlatformMenu *menu = static_cast<const QDBusPlatformMenu *>(item->menu());
        disconnect(menu, &QDBusPlatformMenu::propertiesUpdated,
                   this, &QDBusPlatformMenu::propertiesUpdated);
        disconnect(menu, &QDBusPlatformMenu::updated,
                   this, &QDBusPlatformMenu::updated);
        disconnect(menu, &QDBusPlatformMenu::popupRequested,
                   this, &QDBusPlatformMenu::popupRequested);
    }
    emitUpdated();
}